

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.hpp
# Opt level: O2

void __thiscall
Diligent::ShaderResourceCacheVk::Resource::Resource
          (Resource *this,DescriptorType _Type,bool _HasImmutableSampler)

{
  string msg;
  
  this->Type = _Type;
  this->HasImmutableSampler = _HasImmutableSampler;
  *(undefined8 *)&this->BufferDynamicOffset = 0;
  *(undefined8 *)((long)&(this->pObject).m_pObject + 4) = 0;
  this->BufferBaseOffset = 0;
  this->BufferRangeSize = 0;
  if (CombinedImageSampler < _Type && _HasImmutableSampler) {
    FormatString<char[89]>
              (&msg,(char (*) [89])
                    "Immutable sampler can only be assigned to a combined image sampler or a separate sampler"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Resource",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderResourceCacheVk.hpp"
               ,0x68);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

explicit Resource(DescriptorType _Type, bool _HasImmutableSampler) noexcept :
            Type{_Type},
            HasImmutableSampler{_HasImmutableSampler}
        {
            VERIFY(Type == DescriptorType::CombinedImageSampler || Type == DescriptorType::Sampler || !HasImmutableSampler,
                   "Immutable sampler can only be assigned to a combined image sampler or a separate sampler");
        }